

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

RayTracingPipelineDesc * __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetRayTracingPipelineDesc
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this)

{
  GraphicsPipelineData *pGVar1;
  char (*in_RCX) [37];
  string msg;
  string local_30;
  
  CheckPipelineReady(this);
  if ((this->
      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
      ).m_Desc.PipelineType != PIPELINE_TYPE_RAY_TRACING) {
    FormatString<char[26],char[36]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_Desc.IsRayTracingPipeline()",(char (*) [36])in_RCX);
    in_RCX = (char (*) [37])0x214;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetRayTracingPipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x214);
    std::__cxx11::string::~string((string *)&local_30);
  }
  pGVar1 = (this->field_6).m_pGraphicsPipelineData;
  if (pGVar1 == (GraphicsPipelineData *)0x0) {
    FormatString<char[26],char[37]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pRayTracingPipelineData != nullptr",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetRayTracingPipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x215);
    std::__cxx11::string::~string((string *)&local_30);
    pGVar1 = (this->field_6).m_pGraphicsPipelineData;
  }
  return (RayTracingPipelineDesc *)pGVar1;
}

Assistant:

GetRayTracingPipelineDesc() const override final
    {
        CheckPipelineReady();
        VERIFY_EXPR(this->m_Desc.IsRayTracingPipeline());
        VERIFY_EXPR(m_pRayTracingPipelineData != nullptr);
        return m_pRayTracingPipelineData->Desc;
    }